

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  IdList *pIVar1;
  char *pcVar2;
  long lVar3;
  
  if ((p == (IdList *)0x0) ||
     (pIVar1 = (IdList *)sqlite3DbMallocRawNN(db,(long)p->nId * 8 + 8), pIVar1 == (IdList *)0x0)) {
    pIVar1 = (IdList *)0x0;
  }
  else {
    pIVar1->nId = p->nId;
    if (0 < p->nId) {
      lVar3 = 0;
      do {
        pcVar2 = sqlite3DbStrDup(db,p->a[lVar3].zName);
        pIVar1->a[lVar3].zName = pcVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 < p->nId);
    }
  }
  return pIVar1;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, const IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew)+(p->nId-1)*sizeof(p->a[0]) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    const struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
  }
  return pNew;
}